

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# printer_yin.c
# Opt level: O0

void yprp_augment(lys_ypr_ctx_conflict *pctx,lysp_node_augment *aug)

{
  lysp_node_notif *local_30;
  lysp_node_notif *notif;
  lysp_node_action *action;
  lysp_node *child;
  lysp_node_augment *aug_local;
  lys_ypr_ctx_conflict *pctx_local;
  
  ypr_open(pctx,"augment","target-node",(aug->field_0).node.name,'\x01');
  (pctx->field_0).field_0.level = (pctx->field_0).field_0.level + 1;
  yprp_extension_instances(pctx,LY_STMT_AUGMENT,'\0',(aug->field_0).node.exts,(int8_t *)0x0);
  yprp_when(pctx,aug->when,(int8_t *)0x0);
  yprp_iffeatures(pctx,(aug->field_0).node.iffeatures,(aug->field_0).node.exts,(int8_t *)0x0);
  ypr_status(pctx,(aug->field_0).node.flags,(aug->field_0).node.exts,(int8_t *)0x0);
  ypr_description(pctx,(aug->field_0).node.dsc,(aug->field_0).node.exts,(int8_t *)0x0);
  ypr_reference(pctx,(aug->field_0).node.ref,(aug->field_0).node.exts,(int8_t *)0x0);
  for (action = (lysp_node_action *)aug->child; action != (lysp_node_action *)0x0;
      action = (action->field_0).field_1.next) {
    yprp_node(pctx,(lysp_node *)action);
  }
  for (notif = (lysp_node_notif *)aug->actions; notif != (lysp_node_notif *)0x0;
      notif = (notif->field_0).field_1.next) {
    yprp_action(pctx,(lysp_node_action *)notif);
  }
  for (local_30 = aug->notifs; local_30 != (lysp_node_notif *)0x0;
      local_30 = (local_30->field_0).field_1.next) {
    yprp_notification(pctx,local_30);
  }
  (pctx->field_0).field_0.level = (pctx->field_0).field_0.level - 1;
  ypr_close(pctx,"augment",'\x01');
  return;
}

Assistant:

static void
yprp_augment(struct lys_ypr_ctx *pctx, const struct lysp_node_augment *aug)
{
    struct lysp_node *child;
    struct lysp_node_action *action;
    struct lysp_node_notif *notif;

    ypr_open(pctx, "augment", "target-node", aug->nodeid, 1);
    LEVEL++;

    yprp_extension_instances(pctx, LY_STMT_AUGMENT, 0, aug->exts, NULL);
    yprp_when(pctx, aug->when, NULL);
    yprp_iffeatures(pctx, aug->iffeatures, aug->exts, NULL);
    ypr_status(pctx, aug->flags, aug->exts, NULL);
    ypr_description(pctx, aug->dsc, aug->exts, NULL);
    ypr_reference(pctx, aug->ref, aug->exts, NULL);

    LY_LIST_FOR(aug->child, child) {
        yprp_node(pctx, child);
    }

    LY_LIST_FOR(aug->actions, action) {
        yprp_action(pctx, action);
    }

    LY_LIST_FOR(aug->notifs, notif) {
        yprp_notification(pctx, notif);
    }

    LEVEL--;
    ypr_close(pctx, "augment", 1);
}